

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void CVmObjBigNum::compute_sum(vm_val_t *result,char *ext1,char *ext2)

{
  char *new_ext;
  
  new_ext = compute_init_2op(result,ext1,ext2);
  if (new_ext != (char *)0x0) {
    compute_sum_into(new_ext,ext1,ext2);
    return;
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_sum(VMG_ vm_val_t *result,
                               const char *ext1, const char *ext2)
{
    char *new_ext;

    /* allocate our result value */
    new_ext = compute_init_2op(vmg_ result, ext1, ext2);

    /* we're done if we had a non-number operand */
    if (new_ext == 0)
        return;

    /* compute the sum into the result */
    compute_sum_into(new_ext, ext1, ext2);
}